

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O1

int __thiscall ktxInfo::main(ktxInfo *this,int argc,char **argv)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  pointer pbVar10;
  string infile;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  iVar3 = 0;
  ktxApp::processCommandLine(&this->super_ktxApp,argc,argv,eAllowStdin,eNone);
  pbVar10 = (this->options).infiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 < (this->options).infiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
    do {
      local_50 = local_40;
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pbVar10->_M_string_length);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pFVar4 = _stdin;
      if (iVar2 != 0) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
        pFVar4 = fopen((char *)local_50,(char *)local_70);
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
      }
      if (pFVar4 == (FILE *)0x0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                            (this->super_ktxApp).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," could not open input file \"",0x1c);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar3 == 0) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stdin","");
        }
        else {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_50,(long)local_50 + local_48);
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\". ",3);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
LAB_00105004:
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        iVar3 = 2;
        bVar9 = 0;
      }
      else {
        iVar2 = ktxPrintInfoForStdioStream(pFVar4);
        if (iVar2 == 5) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                              (this->super_ktxApp).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": Error reading \"",0x11);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar3 == 0) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stdin","");
          }
          else {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_50,(long)local_50 + local_48);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          goto LAB_00105004;
        }
        if (iVar2 == 0xf) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                              (this->super_ktxApp).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar3 == 0) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stdin","");
          }
          else {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_50,(long)local_50 + local_48);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," is not a KTX or KTX2 file.",0x1b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          goto LAB_00105004;
        }
        bVar9 = 1;
        if (iVar2 == 7) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                              (this->super_ktxApp).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,": Unexpected end of file reading \"",0x22);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar3 == 0) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stdin","");
          }
          else {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_50,(long)local_50 + local_48);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          goto LAB_00105004;
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while ((bool)(bVar9 & pbVar10 < (this->options).infiles.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish));
  }
  return iVar3;
}

Assistant:

int
ktxInfo::main(int argc, char* argv[])
{
    FILE *inf;
    int exitCode = 0;

    processCommandLine(argc, argv);

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;

        if (!infile.compare("-")) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            KTX_error_code result;

            result = ktxPrintInfoForStdioStream(inf);
            if (result ==  KTX_FILE_UNEXPECTED_EOF) {
                cerr << name
                     << ": Unexpected end of file reading \""
                     << (infile.compare("-") ? infile : "stdin" ) << "\"."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_UNKNOWN_FILE_FORMAT) {
                cerr << name
                     << ": " << (infile.compare("-") ? infile : "stdin")
                     << " is not a KTX or KTX2 file."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_FILE_READ_ERROR) {
                cerr << name
                    << ": Error reading \""
                    << (infile.compare("-") ? infile : "stdin") << "\"."
                    << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}